

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BacktrackingTokenStream.h
# Opt level: O1

StdGrammarToken * __thiscall
SGParser::BacktrackingTokenStream<SGParser::Generator::StdGrammarToken>::GetNextToken
          (BacktrackingTokenStream<SGParser::Generator::StdGrammarToken> *this,
          StdGrammarToken *token)

{
  size_t *psVar1;
  StdGrammarToken *pSVar2;
  ulong uVar3;
  StreamBlock *pSVar4;
  size_t sVar5;
  StreamBlock *pSVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  long lVar8;
  size_t sVar9;
  undefined1 *local_58;
  undefined8 local_50;
  undefined1 local_48;
  undefined7 uStack_47;
  size_t local_38;
  size_t sStack_30;
  
  uVar3 = this->ThisPos;
  if (uVar3 != 0x200) {
    if (this->LengthLeft == 0) {
      local_50 = 0;
      local_48 = 0;
      local_38 = 0;
      sStack_30 = 0;
      (token->super_TokenCode).Code = 1;
      local_58 = &local_48;
      std::__cxx11::string::operator=((string *)&token->Str,(string *)&local_58);
      token->Line = local_38;
      token->Offset = sStack_30;
      if (local_58 != &local_48) {
        operator_delete(local_58,CONCAT71(uStack_47,local_48) + 1);
      }
    }
    else if (uVar3 < this->pThisBlock->Count) {
      pSVar2 = this->pThisBlock->Tokens + uVar3;
      (token->super_TokenCode).Code = (pSVar2->super_TokenCode).Code;
      std::__cxx11::string::_M_assign((string *)&token->Str);
      sVar5 = pSVar2->Offset;
      token->Line = pSVar2->Line;
      token->Offset = sVar5;
      sVar5 = this->ThisPos + 1;
      this->ThisPos = sVar5;
      if (sVar5 == 0x200) {
        this->ThisPos = 0;
        this->pThisBlock = this->pThisBlock->pNext;
      }
    }
    else {
      (*this->pSourceStream->_vptr_TokenStream[2])(this->pSourceStream,token);
      pSVar2 = this->pThisBlock->Tokens + this->ThisPos;
      (pSVar2->super_TokenCode).Code = (token->super_TokenCode).Code;
      std::__cxx11::string::_M_assign((string *)&pSVar2->Str);
      sVar5 = token->Offset;
      pSVar2->Line = token->Line;
      pSVar2->Offset = sVar5;
      if (this->SourceEOFFlag == false) {
        if ((token->super_TokenCode).Code == 1) {
          this->SourceEOFFlag = true;
        }
        pSVar4 = this->pThisBlock;
        sVar5 = this->ThisPos + 1;
        this->ThisPos = sVar5;
        psVar1 = &pSVar4->Count;
        *psVar1 = *psVar1 + 1;
        sVar9 = this->Pos + 1;
        this->Pos = sVar9;
        if (sVar5 == 0x200) {
          pSVar6 = (StreamBlock *)operator_new(0x7018);
          paVar7 = &pSVar6->Tokens[0].Str.field_2;
          lVar8 = 0x7000;
          do {
            *(undefined4 *)((long)paVar7 + -0x18) = 1;
            (((String *)(paVar7 + -1))->_M_dataplus)._M_p = (pointer)paVar7;
            *(size_type *)((long)paVar7 + -8) = 0;
            paVar7->_M_local_buf[0] = '\0';
            paVar7[1]._M_allocated_capacity = 0;
            *(undefined8 *)((long)paVar7 + 0x18) = 0;
            paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)((long)paVar7 + 0x38);
            lVar8 = lVar8 + -0x38;
          } while (lVar8 != 0);
          pSVar6->Index = 0;
          pSVar6->Count = 0;
          pSVar6->pNext = (StreamBlock *)0x0;
          this->ThisPos = 0;
          pSVar4->pNext = pSVar6;
          this->pThisBlock = pSVar6;
          pSVar6->Index = sVar9;
          ReleaseExtraBuffers(this);
        }
      }
    }
    return token;
  }
  __assert_fail("ThisPos != StreamBlock::BufferSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Parser-Builder-Org[P]SGParser/src/Parser/./BacktrackingTokenStream.h"
                ,0x14d,
                "virtual Token &SGParser::BacktrackingTokenStream<SGParser::Generator::StdGrammarToken>::GetNextToken(Token &) [Token = SGParser::Generator::StdGrammarToken]"
               );
}

Assistant:

Token& BacktrackingTokenStream<Token>::GetNextToken(Token& token) {
    // Check if we are in the correct state, i.e.
    // there is a StreamBlock to save the next token
    SG_ASSERT(ThisPos != StreamBlock::BufferSize);

    // Zero length - return EOF Token
    if (LengthLeft == 0u) {
        token = Token{};
        return token;
    }

    // If we are behind the end (backtracked)
    // return next consecutive token
    if (ThisPos < pThisBlock->Count) {
        token = pThisBlock->Tokens[ThisPos];
        ++ThisPos;
        if (ThisPos == StreamBlock::BufferSize) {
            ThisPos    = 0u;
            pThisBlock = pThisBlock->pNext;
        }
        return token;
    }

    // Read next token from original stream
    pSourceStream->GetNextToken(token);
    pThisBlock->Tokens[ThisPos] = token;

    // If source ended earlier, just return EOF value
    if (SourceEOFFlag)
        return token;
    if (token.Code == TokenCode::TokenEOF)
        SourceEOFFlag = true;

    // Increase pointer
    ++ThisPos;
    ++pThisBlock->Count;
    // Final position in stream
    ++Pos;
    if (ThisPos == StreamBlock::BufferSize) {
        // Enforce basic exception safety
        // If new StreamBlock fails then ThisPos will stay equal
        // to StreamBlock::BufferSize and next call to GetNextToken
        // will fail (but BacktrackingTokenStream will stay in safe-to-delete state)
        const auto newBlock = new StreamBlock;
        ThisPos             = 0u;
        pThisBlock->pNext   = newBlock;
        pThisBlock          = pThisBlock->pNext;
        pThisBlock->Index   = Pos;
        // Check for freeing any extra buffers
        ReleaseExtraBuffers();
    }
    return token;
}